

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zonetree.h
# Opt level: O0

void __thiscall
asmjit::v1_14::ZoneTree<asmjit::v1_14::JitAllocatorBlock>::
insert<asmjit::v1_14::Support::Compare<(asmjit::v1_14::Support::SortOrder)0>>
          (ZoneTree<asmjit::v1_14::JitAllocatorBlock> *this,JitAllocatorBlock *node,
          Compare<(asmjit::v1_14::Support::SortOrder)0> *cmp)

{
  bool bVar1;
  ZoneTreeNode *root;
  undefined8 in_RDX;
  ZoneTreeNode *in_RSI;
  long *in_RDI;
  size_t last;
  size_t dir;
  ZoneTreeNode *q;
  ZoneTreeNode *t;
  ZoneTreeNode *p;
  ZoneTreeNode *g;
  ZoneTreeNode head;
  char *in_stack_00000270;
  int in_stack_0000027c;
  char *in_stack_00000280;
  JitAllocatorBlock *in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe80;
  uint in_stack_fffffffffffffe84;
  ZoneTreeNode *local_178;
  ZoneTreeNode *pZVar2;
  ZoneTreeNode *local_158;
  ulong local_148;
  ulong local_140;
  ZoneTreeNode *local_138;
  ZoneTreeNode *local_130;
  ZoneTreeNode *local_128;
  ZoneTreeNode *local_120;
  ZoneTreeNode local_118 [8];
  long local_110;
  undefined8 local_108;
  ZoneTreeNode *local_100;
  ZoneTreeNode *local_d8;
  long local_d0;
  ZoneTreeNode *local_c8;
  ZoneTreeNode *local_c0;
  ZoneTreeNode *local_b8;
  ZoneTreeNode *local_b0;
  ZoneTreeNode *local_a8;
  ZoneTreeNode *local_a0;
  ZoneTreeNode *local_98;
  ulong local_90;
  ZoneTreeNode *local_88;
  ZoneTreeNode *local_80;
  ZoneTreeNode *local_78;
  ZoneTreeNode *local_68;
  ZoneTreeNode *local_60;
  ZoneTreeNode *local_58;
  ulong *local_48;
  ulong *local_40;
  ulong local_38;
  ZoneTreeNode *local_30;
  ulong local_28;
  ZoneTreeNode *local_20;
  ZoneTreeNode *local_18;
  ZoneTreeNode *local_10;
  undefined8 local_8;
  
  if (1 < *(ulong *)in_RSI) {
    DebugUtils::assertionFailed(in_stack_00000280,in_stack_0000027c,in_stack_00000270);
  }
  if (*(ulong *)(in_RSI + 8) == 0) {
    if ((*(ulong *)in_RSI & 1) == 0) {
      if (*in_RDI == 0) {
        *in_RDI = (long)in_RSI;
      }
      else {
        local_158 = local_118;
        local_108 = in_RDX;
        local_100 = in_RSI;
        local_d8 = local_158;
        do {
          *(undefined8 *)local_158 = 0;
          local_158 = local_158 + 8;
        } while (local_158 != (ZoneTreeNode *)&local_108);
        local_d0 = *in_RDI;
        local_c8 = local_118;
        local_120 = (ZoneTreeNode *)0x0;
        local_128 = (ZoneTreeNode *)0x0;
        local_130 = local_118;
        local_138 = (ZoneTreeNode *)*in_RDI;
        local_140 = 0;
        local_148 = 0;
        local_b8 = local_100;
        *(ulong *)local_100 = *(ulong *)local_100 | 1;
        local_110 = local_d0;
        while( true ) {
          if (local_138 == (ZoneTreeNode *)0x0) {
            local_138 = local_100;
            local_88 = local_128;
            local_90 = local_140;
            local_98 = local_100;
            *(ulong *)(local_128 + local_140 * 8) =
                 *(ulong *)(local_128 + local_140 * 8) & 1 | (ulong)local_100;
          }
          else {
            local_78 = local_138;
            bVar1 = _isValidRed((ZoneTreeNode *)(*(ulong *)local_138 & 0xfffffffffffffffe));
            if (bVar1) {
              local_58 = local_138;
              bVar1 = _isValidRed(*(ZoneTreeNode **)(local_138 + 8));
              if (bVar1) {
                local_c0 = local_138;
                *(ulong *)local_138 = *(ulong *)local_138 | 1;
                local_80 = local_138;
                local_40 = (ulong *)(*(ulong *)local_138 & 0xfffffffffffffffe);
                *local_40 = *local_40 & 0xfffffffffffffffe;
                local_60 = local_138;
                local_48 = *(ulong **)(local_138 + 8);
                *local_48 = *local_48 & 0xfffffffffffffffe;
              }
            }
          }
          bVar1 = _isValidRed(local_138);
          if ((bVar1) && (bVar1 = _isValidRed(local_128), bVar1)) {
            local_68 = local_130;
            root = (ZoneTreeNode *)(ulong)(*(ZoneTreeNode **)(local_130 + 8) == local_120);
            local_20 = local_128;
            local_28 = local_148;
            pZVar2 = local_130;
            if (local_138 ==
                (ZoneTreeNode *)(*(ulong *)(local_128 + local_148 * 8) & 0xfffffffffffffffe)) {
              local_178 = _singleRotate(local_120,(ulong)((local_148 != 0 ^ 0xffU) & 1));
            }
            else {
              local_178 = _doubleRotate(root,(size_t)local_130);
            }
            local_b0 = local_178;
            *(ulong *)(pZVar2 + (long)root * 8) =
                 *(ulong *)(pZVar2 + (long)root * 8) & 1 | (ulong)local_178;
            local_a8 = root;
            local_a0 = pZVar2;
          }
          if (local_138 == local_100) break;
          local_148 = local_140;
          local_8 = local_108;
          local_10 = local_138;
          local_18 = local_100;
          bVar1 = JitAllocatorBlock::operator>
                            ((JitAllocatorBlock *)
                             CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                             in_stack_fffffffffffffe78);
          in_stack_fffffffffffffe84 = (uint)bVar1;
          bVar1 = JitAllocatorBlock::operator<
                            ((JitAllocatorBlock *)(ulong)CONCAT14(bVar1,in_stack_fffffffffffffe80),
                             in_stack_fffffffffffffe78);
          local_140 = (ulong)((int)(in_stack_fffffffffffffe84 - bVar1) < 0);
          if (local_120 != (ZoneTreeNode *)0x0) {
            local_130 = local_120;
          }
          local_120 = local_128;
          local_128 = local_138;
          local_30 = local_138;
          local_138 = (ZoneTreeNode *)(*(ulong *)(local_138 + local_140 * 8) & 0xfffffffffffffffe);
          local_38 = local_140;
        }
        *in_RDI = local_110;
        *(ulong *)*in_RDI = *(ulong *)*in_RDI & 0xfffffffffffffffe;
      }
      return;
    }
    DebugUtils::assertionFailed(in_stack_00000280,in_stack_0000027c,in_stack_00000270);
  }
  DebugUtils::assertionFailed(in_stack_00000280,in_stack_0000027c,in_stack_00000270);
}

Assistant:

void insert(NodeT* ASMJIT_NONNULL(node), const CompareT& cmp = CompareT()) noexcept {
    // Node to insert must not contain garbage.
    ASMJIT_ASSERT(!node->hasLeft());
    ASMJIT_ASSERT(!node->hasRight());
    ASMJIT_ASSERT(!node->isRed());

    if (!_root) {
      _root = node;
      return;
    }

    ZoneTreeNode head;           // False root node,
    head._setRight(_root);       // having root on the right.

    ZoneTreeNode* g = nullptr;   // Grandparent.
    ZoneTreeNode* p = nullptr;   // Parent.
    ZoneTreeNode* t = &head;     // Iterator.
    ZoneTreeNode* q = _root;     // Query.

    size_t dir = 0;              // Direction for accessing child nodes.
    size_t last = 0;             // Not needed to initialize, but makes some tools happy.

    node->_makeRed();            // New nodes are always red and violations fixed appropriately.

    // Search down the tree.
    for (;;) {
      if (!q) {
        // Insert new node at the bottom.
        q = node;
        p->_setChild(dir, node);
      }
      else if (_isValidRed(q->_getLeft()) && _isValidRed(q->_getRight())) {
        // Color flip.
        q->_makeRed();
        q->_getLeft()->_makeBlack();
        q->_getRight()->_makeBlack();
      }

      // Fix red violation.
      if (_isValidRed(q) && _isValidRed(p)) {
        ASMJIT_ASSUME(g != nullptr);
        ASMJIT_ASSUME(p != nullptr);
        t->_setChild(t->_getRight() == g,
                     q == p->_getChild(last) ? _singleRotate(g, !last) : _doubleRotate(g, !last));
      }

      // Stop if found.
      if (q == node)
        break;

      last = dir;
      dir = cmp(*static_cast<NodeT*>(q), *static_cast<NodeT*>(node)) < 0;

      // Update helpers.
      if (g) t = g;

      g = p;
      p = q;
      q = q->_getChild(dir);
    }

    // Update root and make it black.
    _root = static_cast<NodeT*>(head._getRight());
    _root->_makeBlack();
  }